

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

bool __thiscall
Clasp::Asp::PrgAtom::addConstraints(PrgAtom *this,LogicProgram *prg,ClauseCreator *gc)

{
  byte *pbVar1;
  PrgNode PVar2;
  pointer pLVar3;
  pointer pVVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  ClauseCreator *pCVar8;
  ulong uVar9;
  byte bVar10;
  pointer pPVar11;
  long lVar12;
  pointer pPVar13;
  bool bVar14;
  Result RVar15;
  Literal B;
  Literal local_54;
  SharedContext *local_50;
  ClauseCreator *local_48;
  LitVec *local_40;
  Literal local_34;
  
  local_50 = (prg->super_ProgramBuilder).ctx_;
  pPVar11 = (this->super_PrgHead).supports_.ebo_.buf;
  bVar10 = 0;
  pCVar8 = ClauseCreator::start(gc,Static);
  local_34.rep_ = *(int *)&(this->super_PrgHead).super_PrgNode * 2 ^ 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (&pCVar8->literals_,&local_34);
  bVar14 = (this->super_PrgHead).supports_.ebo_.size == 0;
  if (!bVar14) {
    pPVar13 = (this->super_PrgHead).supports_.ebo_.buf;
    local_40 = &gc->literals_;
    bVar10 = 0;
    local_48 = gc;
    do {
      PVar2 = (&prg->bodies_)[(ulong)((pPVar13->rep & 0xc) != 4) * 2].ebo_.buf[pPVar13->rep >> 4]->
              super_PrgNode;
      uVar7 = PVar2._0_4_;
      local_54.rep_ = uVar7 * 2;
      bVar6 = true;
      if ((uVar7 & 0x7fffffff) != 1 && (PVar2._7_1_ >> 6 & 1) == 0) {
        pPVar11->rep = pPVar13->rep;
        bVar5 = bVar10 & 1;
        bVar10 = 1;
        if (bVar5 == 0) {
          bVar10 = (byte)pPVar13->rep >> 1;
        }
        if ((pPVar13->rep & 0xc) != 8) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (local_40,&local_54);
        }
        pPVar11 = pPVar11 + 1;
        bVar6 = true;
        if ((pPVar13->rep & 2) == 0) {
          bVar6 = SharedContext::addBinary
                            (local_50,(Literal)(*(int *)&(this->super_PrgHead).super_PrgNode * 2),
                             (Literal)(local_54.rep_ & 0xfffffffe ^ 2));
        }
      }
      gc = local_48;
      if (bVar6 == false) break;
      pPVar13 = pPVar13 + 1;
      bVar14 = pPVar13 ==
               (this->super_PrgHead).supports_.ebo_.buf + (this->super_PrgHead).supports_.ebo_.size;
    } while (!bVar14);
  }
  if (!bVar14) {
    return false;
  }
  uVar7 = (this->super_PrgHead).supports_.ebo_.size;
  (this->super_PrgHead).supports_.ebo_.size =
       uVar7 - (int)((long)(this->super_PrgHead).supports_.ebo_.buf +
                     ((ulong)uVar7 * 4 - (long)pPVar11) >> 2);
  if ((bVar10 & 1) == 0) {
    uVar9 = (ulong)(this->deps_).ebo_.size;
    bVar14 = uVar9 != 0;
    if ((bVar14) && (pLVar3 = (this->deps_).ebo_.buf, (pLVar3->rep_ & 2) == 0)) {
      lVar12 = 4;
      do {
        bVar6 = uVar9 << 2 == lVar12;
        bVar14 = !bVar6;
        if (bVar6) break;
        pbVar1 = (byte *)((long)&pLVar3->rep_ + lVar12);
        lVar12 = lVar12 + 4;
      } while ((*pbVar1 & 2) == 0);
    }
    if (!bVar14) goto LAB_0014c076;
  }
  uVar7 = *(uint *)&(this->super_PrgHead).super_PrgNode >> 1 & 0x3fffffff;
  pVVar4 = (local_50->varInfo_).ebo_.buf;
  bVar10 = pVVar4[uVar7].rep;
  if ((bVar10 & 0x20) == 0) {
    pVVar4[uVar7].rep = bVar10 | 0x20;
  }
LAB_0014c076:
  RVar15 = ClauseCreator::end(gc,0x100);
  return ((undefined1  [16])RVar15 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
}

Assistant:

bool PrgAtom::addConstraints(const LogicProgram& prg, ClauseCreator& gc) {
	SharedContext& ctx  = *prg.ctx();
	EdgeVec::iterator j = supports_.begin();
	bool           nant = false;
	gc.start().add(~literal());
	for (EdgeVec::iterator it = supports_.begin(); it != supports_.end(); ++it) {
		PrgNode* n = prg.getSupp(*it);
		Literal  B = n->literal();
		// consider only bodies which are part of the simplified program, i.e.
		// are associated with a variable in the solver.
		if (n->relevant() && n->hasVar()) {
			*j++ = *it;
			nant = nant || it->isChoice();
			if (!it->isDisj()) { gc.add(B); }
			if (it->isNormal() && !ctx.addBinary(literal(), ~B)) { // FTA/BFA
				return false;
			}
		}
	}
	supports_.erase(j, supports_.end());
	if (nant ||	hasDep(PrgAtom::dep_neg)) { ctx.setNant(var(), true); }
	return gc.end(ClauseCreator::clause_force_simplify);
}